

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O0

void sprintf<int,int,char_const*>(stringstream *oss,string *fmt,int value,int args,char *args_1)

{
  fmtflags __a;
  _Ios_Fmtflags _Var1;
  int __n;
  ulong uVar2;
  char *pcVar3;
  undefined1 *puVar4;
  long lVar5;
  runtime_error *this;
  undefined4 in_ECX;
  undefined4 in_EDX;
  stringstream *in_RSI;
  ulong uVar6;
  long *in_RDI;
  undefined8 in_R8;
  invalid_argument *e_1;
  size_t afterpos_1;
  int precision;
  invalid_argument *e;
  int width;
  size_t afterpos;
  size_t fpos;
  bool alternateForm;
  size_t pos;
  size_t *in_stack_fffffffffffffeb8;
  string *in_stack_fffffffffffffec0;
  string local_e8 [44];
  int local_bc;
  string local_b8 [32];
  long local_98;
  int local_8c;
  int local_80;
  string local_70 [36];
  int local_4c;
  long local_48;
  char local_39;
  ulong local_38;
  byte local_29;
  ulong uVar7;
  int value_00;
  
  uVar7 = 0;
  do {
    uVar6 = uVar7;
    uVar2 = std::__cxx11::string::size();
    if (uVar2 <= uVar7) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"extra arguments provided to sprintf");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
    if (*pcVar3 == '%') {
      uVar6 = uVar6 + 1;
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
      if (*pcVar3 != '%') {
        local_29 = 0;
        local_38 = std::__cxx11::string::find_first_of((char *)in_RSI,0x15a20f);
        break;
      }
    }
    in_stack_fffffffffffffec0 = (string *)(in_RDI + 2);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
    std::operator<<((ostream *)in_stack_fffffffffffffec0,*pcVar3);
    uVar7 = uVar6 + 1;
  } while( true );
LAB_0012218e:
  value_00 = (int)((ulong)in_R8 >> 0x20);
  if (local_38 <= uVar6) {
LAB_0012229f:
    std::__cxx11::string::substr((ulong)local_70,(ulong)in_RSI);
    __n = std::__cxx11::stoi(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,0);
    std::__cxx11::string::~string(local_70);
    local_4c = __n;
    local_80 = (int)std::setw(__n);
    std::operator<<((ostream *)(in_RDI + 2),(_Setw)local_80);
    lVar5 = local_48 + uVar6;
    local_8c = 0;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
    if (*pcVar3 == '.') {
      lVar5 = lVar5 + 1;
      std::__cxx11::string::substr((ulong)local_b8,(ulong)in_RSI);
      local_8c = std::__cxx11::stoi(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,0);
      std::__cxx11::string::~string(local_b8);
      local_bc = (int)std::setprecision(local_8c);
      std::operator<<((ostream *)(in_RDI + 2),(_Setprecision)local_bc);
      local_8c = 0;
      lVar5 = local_98 + lVar5;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
    if (((*pcVar3 == 'x') ||
        (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI), *pcVar3 == 'X')) &&
       (std::ostream::operator<<(in_RDI + 2,std::hex), (local_29 & 1) != 0)) {
      std::ostream::operator<<(in_RDI + 2,std::showbase);
    }
    streamout<int>((stringstream *)in_stack_fffffffffffffec0,
                   (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(int)in_stack_fffffffffffffeb8);
    pcVar3 = (char *)(lVar5 + 1);
    std::__cxx11::string::substr((ulong)local_e8,(ulong)in_RSI);
    sprintf<int,char_const*>(in_RSI,(string *)CONCAT44(in_EDX,in_ECX),value_00,pcVar3);
    std::__cxx11::string::~string(local_e8);
    return;
  }
  puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RSI);
  value_00 = (int)((ulong)in_R8 >> 0x20);
  switch(*puVar4) {
  case 0x20:
    break;
  default:
    goto LAB_0012229f;
  case 0x23:
    local_29 = 1;
    break;
  case 0x2b:
    std::ostream::operator<<(in_RDI + 2,std::showpos);
    break;
  case 0x2d:
    std::ostream::operator<<(in_RDI + 2,std::left);
    break;
  case 0x30:
    __a = std::ios_base::flags((ios_base *)((long)in_RDI + *(long *)(*in_RDI + -0x18)));
    _Var1 = std::operator&(__a,_S_left);
    if (_Var1 == ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max)) {
      local_39 = (char)std::setfill<char>('0');
      std::operator<<(in_RDI + 2,local_39);
    }
  }
  uVar6 = uVar6 + 1;
  goto LAB_0012218e;
}

Assistant:

void
sprintf(stringstream& oss, const string& fmt, T value, Args ... args)
{
    for (size_t pos = 0; pos < fmt.size(); pos++) {
        if (fmt[pos] == '%' && fmt[++pos] != '%') {
            bool alternateForm = false;
            // Find the format character
            size_t fpos = fmt.find_first_of("diouXxfFeEgGaAcsb", pos);
            for (; pos < fpos; pos++) {
                switch (fmt[pos]) {
                  case '#':
                    alternateForm = true;
                    continue;
                  case '-':
                    oss << left;
                    continue;
                  case '+':
                    oss << showpos;
                    continue;
                  case ' ':
                    continue;
                  case '0':
                    if (!(oss.flags() & oss.left))
                        oss << setfill('0');
                    continue;
                  default:
                    break;
                }
                break;
            }
            try {
                size_t afterpos;
                int width = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                oss << setw(width);
                pos += afterpos;
            } catch (invalid_argument& e) {
                (void)e;
            }
            int precision = 0;
            if (fmt[pos] == '.') try {
                size_t afterpos;
                ++pos;
                precision = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                if (!std::is_same<T, const char*>::value) {
                     oss << setprecision(precision);
                     precision = 0;
                }
                pos += afterpos;
            } catch (invalid_argument& e) {
                throw std::runtime_error("Expected precision value in sprintf");
                (void)e;
            }
            if (fmt[pos] == 'x' || fmt[pos] == 'X') {
                oss << hex;
                if (alternateForm) oss << showbase;
            }
            // Having another function call sucks. See streamout for the reason.
            streamout(oss, value, precision);
            return sprintf(oss, fmt.substr(++pos), args...);
        }
        oss << fmt[pos];
    }
    throw std::runtime_error("extra arguments provided to sprintf");
}